

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O2

void __thiscall
wasm::LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::scanLivenessThroughActions
          (LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *this,
          vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions,
          SetOfLocals *live)

{
  int iVar1;
  Expression **ppEVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (long)((this->
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>)
                 .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.usedFixed -
                (long)(this->
                      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                      ).super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep) /
          0x18;
  lVar4 = (uVar3 & 0xffffffff) * 0x18 + -0x14;
  for (; 0 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    ppEVar2 = (this->
              super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>).
              super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep;
    iVar1 = *(int *)((long)ppEVar2 + lVar4 + -4);
    if (iVar1 == 0) {
      SortedVector::insert((SortedVector *)actions,*(Index *)((long)ppEVar2 + lVar4));
    }
    else if (iVar1 == 1) {
      SortedVector::erase((SortedVector *)actions,*(Index *)((long)ppEVar2 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  }
  return;
}

Assistant:

void scanLivenessThroughActions(std::vector<LivenessAction>& actions,
                                  SetOfLocals& live) {
    // move towards the front
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      if (action.isGet()) {
        live.insert(action.index);
      } else if (action.isSet()) {
        live.erase(action.index);
      }
    }
  }